

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> __thiscall
slang::driver::Driver::createCompilation(Driver *this)

{
  bool bVar1;
  long in_RSI;
  __uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
  in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> *tree_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2_1;
  shared_ptr<slang::syntax::SyntaxTree> *in_stack_00000090;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  const_iterator __end2;
  const_iterator __begin2;
  SyntaxTreeList *__range2;
  SourceLibrary *defaultLib;
  __single_object *compilation;
  pointer in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  SourceLibrary **__args_1;
  Driver *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_c0;
  long local_b8;
  reference local_a0;
  shared_ptr<slang::syntax::SyntaxTree> *local_98;
  __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_90;
  SourceLoader *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  SourceLibrary *local_70 [6];
  undefined1 local_39;
  __sv_type local_28;
  SourceLibrary *local_18;
  
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x22d5c4);
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x22d5e5);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22d5ed
                      );
    if (!bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x22d617);
      local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffed0)
      ;
      local_18 = SourceLoader::getOrAddLibrary(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
      goto LAB_0022d699;
    }
  }
  in_stack_fffffffffffffef8 = (Driver *)(in_RSI + 0x1030);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_18 = SourceLoader::getOrAddLibrary(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
LAB_0022d699:
  local_18->isDefault = true;
  local_39 = 0;
  __args_1 = local_70;
  createOptionBag(in_stack_fffffffffffffef8);
  std::make_unique<slang::ast::Compilation,slang::Bag,slang::SourceLibrary*&>
            ((Bag *)in_stack_fffffffffffffef8,__args_1);
  Bag::~Bag((Bag *)0x22d6ee);
  SourceLoader::getLibraryMaps((SourceLoader *)(in_RSI + 0x1030));
  local_90._M_current =
       (shared_ptr<slang::syntax::SyntaxTree> *)
       std::
       vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ::begin((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                *)in_stack_fffffffffffffec8);
  local_98 = (shared_ptr<slang::syntax::SyntaxTree> *)
             std::
             vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ::end((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                    *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
               ::operator*(&local_90);
    std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
    operator->((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> *
               )0x22d77c);
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffed0,
               (shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffec8);
    ast::Compilation::addSyntaxTree((Compilation *)tree,in_stack_00000090);
    std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)0x22d7b9);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(&local_90);
  }
  local_b8 = in_RSI + 0x1190;
  local_c0._M_current =
       (shared_ptr<slang::syntax::SyntaxTree> *)
       std::
       vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ::begin((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                *)in_stack_fffffffffffffec8);
  local_e0.field_2._8_8_ =
       std::
       vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ::end((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
              *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                           ((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_e0.field_2._M_allocated_capacity =
         (size_type)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
         ::operator*(&local_c0);
    in_stack_fffffffffffffec8 =
         std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
         operator->((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
                     *)0x22d897);
    in_stack_fffffffffffffed0 = &local_e0;
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffed0,
               (shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffec8);
    ast::Compilation::addSyntaxTree((Compilation *)tree,in_stack_00000090);
    std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)0x22d8c9);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(&local_c0);
  }
  return (__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
          )(tuple<slang::ast::Compilation_*,_std::default_delete<slang::ast::Compilation>_>)
           in_RDI.
           super___uniq_ptr_impl<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::Compilation_*,_std::default_delete<slang::ast::Compilation>_>
           .super__Head_base<0UL,_slang::ast::Compilation_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Compilation> Driver::createCompilation() {
    SourceLibrary* defaultLib;
    if (options.defaultLibName && !options.defaultLibName->empty())
        defaultLib = sourceLoader.getOrAddLibrary(*options.defaultLibName);
    else
        defaultLib = sourceLoader.getOrAddLibrary("work");

    SLANG_ASSERT(defaultLib);
    defaultLib->isDefault = true;

    auto compilation = std::make_unique<Compilation>(createOptionBag(), defaultLib);
    for (auto& tree : sourceLoader.getLibraryMaps())
        compilation->addSyntaxTree(tree);
    for (auto& tree : syntaxTrees)
        compilation->addSyntaxTree(tree);

    return compilation;
}